

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O3

Ptr __thiscall core::image::load_jpg_file(image *this,string *filename,string *exif)

{
  _Alloc_hider _Var1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  Image<unsigned_char> *__p;
  FileException *this_00;
  int *piVar4;
  char *msg;
  Exception *pEVar5;
  char *data;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Image<unsigned_char> *__tmp;
  Ptr PVar6;
  code *local_398;
  jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  string local_50;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar4 = __errno_location();
    msg = strerror(*piVar4);
    util::FileException::FileException(this_00,filename,msg);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  jerr._160_8_ = jpeg_std_error(&local_398);
  local_398 = jpg_error_handler;
  jerr.error_exit = jpg_message_handler;
  jpeg_CreateDecompress(&jerr.first_addon_message,0x50,0x290);
  jpeg_stdio_src(&jerr.first_addon_message,__stream);
  if (exif != (string *)0x0) {
    jpeg_save_markers(&jerr.first_addon_message,0xe1,0xffff);
  }
  iVar2 = jpeg_read_header(&jerr.first_addon_message,0);
  if (iVar2 != 1) {
    pEVar5 = (Exception *)__cxa_allocate_exception(0x28);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"JPEG header not recognized","");
    util::Exception::Exception(pEVar5,&local_50);
    __cxa_throw(pEVar5,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  if ((((exif != (string *)0x0) && (cinfo._392_8_ != 0)) && (*(char *)(cinfo._392_8_ + 8) == -0x1f))
     && (6 < *(uint *)(cinfo._392_8_ + 0x10))) {
    lVar3 = 0;
    do {
      if ((uint)*(byte *)(*(ulong *)(cinfo._392_8_ + 0x18) + lVar3) != (int)"Exif"[lVar3])
      goto LAB_0012b856;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    std::__cxx11::string::replace
              ((ulong)exif,exif->_M_string_length,(char *)0x0,*(ulong *)(cinfo._392_8_ + 0x18));
  }
LAB_0012b856:
  if (0xfffffffd < cinfo.num_components - 3U) {
    __p = (Image<unsigned_char> *)operator_new(0x30);
    iVar2 = (uint)(cinfo.num_components == 2) * 2 + 1;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0014cd28;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.w = (int)cinfo.src;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.h = cinfo.src._4_4_;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.c = iVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&(__p->super_TypedImageBase<unsigned_char>).data,
               (long)((int)cinfo.src * iVar2 * cinfo.src._4_4_));
    local_50._M_dataplus._M_p = (pointer)__p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_char>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length,__p);
    _Var1._M_p = local_50._M_dataplus._M_p;
    *(pointer *)this = local_50._M_dataplus._M_p;
    *(size_type *)(this + 8) = local_50._M_string_length;
    jpeg_start_decompress(&jerr.first_addon_message);
    local_50._M_dataplus._M_p =
         (pointer)(((ImageData *)(_Var1._M_p + 0x18))->
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if ((uint)cinfo.colormap < (uint)cinfo.enable_2pass_quant) {
      do {
        jpeg_read_scanlines(&jerr.first_addon_message,&local_50,1);
        local_50._M_dataplus._M_p =
             local_50._M_dataplus._M_p + (uint)(cinfo.enable_external_quant * iVar2);
      } while ((uint)cinfo.colormap < (uint)cinfo.enable_2pass_quant);
    }
    jpeg_finish_decompress(&jerr.first_addon_message);
    jpeg_destroy_decompress(&jerr.first_addon_message);
    fclose(__stream);
    PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  pEVar5 = (Exception *)__cxa_allocate_exception(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Invalid JPEG color space","")
  ;
  util::Exception::Exception(pEVar5,&local_50);
  __cxa_throw(pEVar5,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

ByteImage::Ptr
load_jpg_file (std::string const& filename, std::string* exif)
{
    FILE* fp = std::fopen(filename.c_str(), "rb");
    if (fp == nullptr)
        throw util::FileException(filename, std::strerror(errno));

    jpeg_decompress_struct cinfo;
    jpeg_error_mgr jerr;
    ByteImage::Ptr image;
    try
    {
        /* Setup error handler and JPEG reader. */
        cinfo.err = jpeg_std_error(&jerr);
        jerr.error_exit = &jpg_error_handler;
        jerr.emit_message = &jpg_message_handler;
        jpeg_create_decompress(&cinfo);
        jpeg_stdio_src(&cinfo, fp);

        if (exif)
        {
            /* Request APP1 marker to be saved (this is the EXIF data). */
            jpeg_save_markers(&cinfo, JPEG_APP0 + 1, 0xffff);
        }

        /* Read JPEG header. */
        int ret = jpeg_read_header(&cinfo, static_cast<boolean>(false));
        if (ret != JPEG_HEADER_OK)
            throw util::Exception("JPEG header not recognized");

        /* Examine JPEG markers. */
        if (exif)
        {
            jpeg_saved_marker_ptr marker = cinfo.marker_list;
            if (marker != nullptr && marker->marker == JPEG_APP0 + 1
                && marker->data_length > 6
                && std::equal(marker->data, marker->data + 6, "Exif\0\0"))
            {
                char const* data = reinterpret_cast<char const*>(marker->data);
                exif->append(data, data + marker->data_length);
            }
        }

        if (cinfo.out_color_space != JCS_GRAYSCALE
            && cinfo.out_color_space != JCS_RGB)
            throw util::Exception("Invalid JPEG color space");

        /* Create image. */
        int const width = cinfo.image_width;
        int const height = cinfo.image_height;
        int const channels = (cinfo.out_color_space == JCS_RGB ? 3 : 1);
        image = ByteImage::create(width, height, channels);
        ByteImage::ImageData& data = image->get_data();

        /* Start decompression. */
        jpeg_start_decompress(&cinfo);

        unsigned char* data_ptr = &data[0];
        while (cinfo.output_scanline < cinfo.output_height)
        {
            jpeg_read_scanlines(&cinfo, &data_ptr, 1);
            data_ptr += channels * cinfo.output_width;
        }

        /* Shutdown JPEG decompression. */
        jpeg_finish_decompress(&cinfo);
        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
    }
    catch (...)
    {
        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
        throw;
    }

    return image;
}